

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

size_t anon_unknown.dwarf_3697931::parent_path_end(StringRef path,Style style)

{
  char cVar1;
  size_t sVar2;
  Style in_ECX;
  StringRef str;
  StringRef str_00;
  bool local_62;
  bool local_61;
  size_t root_dir_pos;
  bool filename_was_sep;
  ulong local_30;
  size_t end_pos;
  undefined1 auStack_20 [4];
  Style style_local;
  StringRef path_local;
  
  str.Data = (char *)path.Length;
  _auStack_20 = (anon_unknown_dwarf_3697931 *)path.Data;
  str.Length._0_4_ = style;
  str.Length._4_4_ = 0;
  path_local.Data = str.Data;
  local_30 = filename_pos(_auStack_20,str,in_ECX);
  sVar2 = llvm::StringRef::size((StringRef *)auStack_20);
  local_61 = false;
  if (sVar2 != 0) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_20,local_30);
    local_61 = llvm::sys::path::is_separator(cVar1,style);
  }
  str_00.Length._0_4_ = style;
  str_00.Data = path_local.Data;
  str_00.Length._4_4_ = 0;
  sVar2 = root_dir_start(_auStack_20,str_00,(Style)sVar2);
  while( true ) {
    local_62 = false;
    if ((local_30 != 0) && ((sVar2 == 0xffffffffffffffff || (local_62 = false, sVar2 < local_30))))
    {
      cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_20,local_30 - 1);
      local_62 = llvm::sys::path::is_separator(cVar1,style);
    }
    if (local_62 == false) break;
    local_30 = local_30 - 1;
  }
  if ((local_30 == sVar2) && (local_61 == false)) {
    path_local.Length = sVar2 + 1;
  }
  else {
    path_local.Length = local_30;
  }
  return path_local.Length;
}

Assistant:

size_t parent_path_end(StringRef path, Style style) {
    size_t end_pos = filename_pos(path, style);

    bool filename_was_sep =
        path.size() > 0 && is_separator(path[end_pos], style);

    // Skip separators until we reach root dir (or the start of the string).
    size_t root_dir_pos = root_dir_start(path, style);
    while (end_pos > 0 &&
           (root_dir_pos == StringRef::npos || end_pos > root_dir_pos) &&
           is_separator(path[end_pos - 1], style))
      --end_pos;

    if (end_pos == root_dir_pos && !filename_was_sep) {
      // We've reached the root dir and the input path was *not* ending in a
      // sequence of slashes. Include the root dir in the parent path.
      return root_dir_pos + 1;
    }

    // Otherwise, just include before the last slash.
    return end_pos;
  }